

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_3;
  ReplicatedAssignmentPatternSyntax *pRVar1;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_70,
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x30),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x40),
                      (BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::ReplicatedAssignmentPatternSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_40,(ExpressionSyntax *)args_1,&local_70,
                      args_3,&local_50,&local_60);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const ReplicatedAssignmentPatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ReplicatedAssignmentPatternSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.countExpr, alloc),
        node.innerOpenBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.innerCloseBrace.deepClone(alloc),
        node.closeBrace.deepClone(alloc)
    );
}